

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::DefaultFieldComparator::CompareDoubleOrFloat<float>
          (DefaultFieldComparator *this,FieldDescriptor *field,float value_1,float value_2)

{
  second_type *psVar1;
  byte bVar2;
  second_type *psVar3;
  bool bVar4;
  FieldDescriptor *local_30;
  float local_28;
  float local_14;
  
  if ((value_1 == value_2) && (!NAN(value_1) && !NAN(value_2))) {
    return true;
  }
  bVar4 = this->float_comparison_ != EXACT;
  bVar2 = (NAN(value_2) && NAN(value_1)) & this->treat_nan_as_equal_;
  if (bVar4 && bVar2 == 0) {
    local_30 = field;
    local_28 = value_1;
    local_14 = value_2;
    psVar1 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::util::DefaultFieldComparator::Tolerance,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::DefaultFieldComparator::Tolerance>>>>
                       (&this->map_tolerance_,&local_30);
    psVar3 = (second_type *)0x0;
    if ((this->has_default_tolerance_ & 1U) != 0) {
      psVar3 = &this->default_tolerance_;
    }
    if (psVar1 != (second_type *)0x0) {
      psVar3 = psVar1;
    }
    if (psVar3 == (second_type *)0x0) {
      bVar4 = ABS(local_28 - local_14) < 3.8146973e-06;
    }
    else {
      bVar4 = MathUtil::WithinFractionOrMargin<float>
                        (local_28,local_14,(float)psVar3->fraction,(float)psVar3->margin);
    }
  }
  else {
    bVar4 = (bool)(bVar4 | bVar2);
  }
  return bVar4;
}

Assistant:

bool DefaultFieldComparator::CompareDoubleOrFloat(const FieldDescriptor& field,
                                                  T value_1, T value_2) {
  if (value_1 == value_2) {
    // Covers +inf and -inf (which are not within margin or fraction of
    // themselves), and is a shortcut for finite values.
    return true;
  } else if (float_comparison_ == EXACT) {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    return false;
  } else {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    // float_comparison_ == APPROXIMATE covers two use cases.
    Tolerance* tolerance = FindOrNull(map_tolerance_, &field);
    if (tolerance == NULL && has_default_tolerance_) {
      tolerance = &default_tolerance_;
    }
    if (tolerance == NULL) {
      return MathUtil::AlmostEquals(value_1, value_2);
    } else {
      // Use user-provided fraction and margin. Since they are stored as
      // doubles, we explicitly cast them to types of values provided. This
      // is very likely to fail if provided values are not numeric.
      return MathUtil::WithinFractionOrMargin(
          value_1, value_2, static_cast<T>(tolerance->fraction),
          static_cast<T>(tolerance->margin));
    }
  }
}